

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlabKosorajo.c
# Opt level: O2

int feederBig(void)

{
  int iVar1;
  FILE *__stream;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
    iVar1 = -1;
  }
  else {
    fprintf(__stream,"%d\n",2000);
    fprintf(__stream,"%d\n",0x1e8098);
    uVar3 = 2;
    uVar2 = 0;
    while (uVar2 != 1999) {
      uVar2 = uVar2 + 1;
      for (uVar4 = uVar3; uVar4 != 0x7d1; uVar4 = uVar4 + 1) {
        fprintf(__stream,"%d %d\n",(ulong)uVar2,(ulong)uVar4);
      }
      uVar3 = uVar3 + 1;
    }
    fclose(__stream);
    LabMemoryLimit = 0x7d4f50;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int feederBig(void)
{
    FILE *const in = fopen("in.txt", "w+");

    if (!in)
    {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }

    fprintf(in, "%d\n", N_MAX);
    fprintf(in, "%d\n", N_MAX * (N_MAX - 1) / 2);

    for (int i = 0; i + 1 < N_MAX; i++)
    {
        for (int j = i + 1; j < N_MAX; j++)
            fprintf(in, "%d %d\n", i + 1, j + 1);
    }

    fclose(in);

    LabMemoryLimit = N_MAX * 10 + N_MAX * (N_MAX - 1) + MIN_PROCESS_RSS_BYTES;

    return 0;
}